

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_at_one.cpp
# Opt level: O0

void * parallel_inc(void *arg)

{
  ostream *poVar1;
  Argument *p;
  void *arg_local;
  
  do {
  } while (**arg != *(long *)((long)arg + 8));
  poVar1 = std::operator<<((ostream *)&std::cout,"thread #");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)((long)arg + 8));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  **arg = **arg + 1;
  return (void *)0x0;
}

Assistant:

void *parallel_inc(void * arg){
  auto p = reinterpret_cast<Argument *>(arg);
  while(*(p->x) != p->n);
  //usleep(1);
  std::cout << "thread #" << p->n << std::endl;
  ++*(p->x);
  return nullptr;
}